

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowImpl.cpp
# Opt level: O2

void __thiscall FlowImpl::FlowImpl(FlowImpl *this,FlowImpl *f)

{
  (this->super_Flow)._vptr_Flow = (_func_int **)&PTR___cxa_pure_virtual_00107c48;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (*(f->super_Flow)._vptr_Flow[1])(f,this->target);
  return;
}

Assistant:

FlowImpl::FlowImpl(FlowImpl *f) {
    f->setTarget(target);

}